

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ReturnStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ReturnStatement,slang::ast::Expression_const*&,slang::SourceRange>
          (BumpAllocator *this,Expression **args,SourceRange *args_1)

{
  Expression *pEVar1;
  SourceLocation SVar2;
  SourceLocation SVar3;
  ReturnStatement *pRVar4;
  
  pRVar4 = (ReturnStatement *)allocate(this,0x28,8);
  pEVar1 = *args;
  SVar2 = args_1->startLoc;
  SVar3 = args_1->endLoc;
  (pRVar4->super_Statement).kind = Return;
  (pRVar4->super_Statement).syntax = (StatementSyntax *)0x0;
  (pRVar4->super_Statement).sourceRange.startLoc = SVar2;
  (pRVar4->super_Statement).sourceRange.endLoc = SVar3;
  pRVar4->expr = pEVar1;
  return pRVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }